

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
          (anon_unknown_0 *this,Descriptor *message,string_view classname,NameEquality equality_mode
          )

{
  bool bVar1;
  NameEquality NVar2;
  long lVar3;
  long lVar4;
  string_view a;
  string_view a_00;
  string_view b;
  string_view classname_00;
  string_view b_00;
  
  a._M_str = (char *)**(undefined8 **)(this + 8);
  a._M_len = (*(undefined8 **)(this + 8))[1];
  b._M_str = (char *)classname._M_len;
  b._M_len = (size_t)message;
  NVar2 = CheckNameEquality(a,b);
  bVar1 = true;
  if (NVar2 != (NameEquality)classname._M_str) {
    if (0 < *(int *)(this + 0x80)) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        classname_00._M_str._4_4_ = 0;
        classname_00._0_12_ = classname._0_12_;
        bVar1 = MessageHasConflictingClassName
                          ((anon_unknown_0 *)(*(long *)(this + 0x48) + lVar3),message,classname_00,
                           equality_mode);
        if (bVar1) {
          return true;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x98;
      } while (lVar4 < *(int *)(this + 0x80));
    }
    if (*(int *)(this + 0x84) < 1) {
      bVar1 = false;
    }
    else {
      lVar4 = 8;
      lVar3 = 0;
      do {
        a_00._M_str = (char *)**(undefined8 **)(*(long *)(this + 0x50) + lVar4);
        a_00._M_len = (*(undefined8 **)(*(long *)(this + 0x50) + lVar4))[1];
        b_00._M_str = (char *)classname._M_len;
        b_00._M_len = (size_t)message;
        NVar2 = CheckNameEquality(a_00,b_00);
        bVar1 = NVar2 == (NameEquality)classname._M_str;
        if (bVar1) {
          return bVar1;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x58;
      } while (lVar3 < *(int *)(this + 0x84));
    }
  }
  return bVar1;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    absl::string_view classname,
                                    NameEquality equality_mode) {
  if (CheckNameEquality(message->name(), classname) == equality_mode) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (CheckNameEquality(message->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  return false;
}